

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

exr_result_t validate_deep_data(exr_context_t f,exr_priv_part_t curpart)

{
  uint uVar1;
  exr_attr_chlist_t *peVar2;
  exr_attr_chlist_entry_t *peVar3;
  ulong uVar4;
  exr_result_t eVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if ((curpart->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) {
    if (EXR_COMPRESSION_ZIPS < curpart->comp_type) {
      eVar5 = (*f->report_error)(f,0xe,"Invalid compression for deep data");
      return eVar5;
    }
    peVar2 = (curpart->channels->field_6).chlist;
    uVar1 = peVar2->num_channels;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
    }
    uVar4 = 0;
    while (uVar8 = uVar4, uVar6 * 0x20 + 0x20 != uVar8 + 0x20) {
      peVar3 = peVar2->entries;
      if (*(int *)(peVar3->reserved + uVar8 + 3) != 1) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        uVar7 = *(undefined8 *)(peVar3->reserved + (uVar8 - 0xd));
        pcVar9 = "channel \'%s\': x subsampling factor is not 1 (%d) for a deep image";
        goto LAB_0012b9ab;
      }
      uVar4 = uVar8 + 0x20;
      if (*(int *)(peVar3->reserved + uVar8 + 7) != 1) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        uVar7 = *(undefined8 *)(peVar3->reserved + (uVar8 - 0xd));
        pcVar9 = "channel \'%s\': y subsampling factor is not 1 (%d) for a deep image";
LAB_0012b9ab:
        eVar5 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar9,uVar7);
        return eVar5;
      }
    }
  }
  return 0;
}

Assistant:

static exr_result_t
validate_deep_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_chlist_t* channels = curpart->channels->chlist;

        // none, rle, zips
        if (curpart->comp_type != EXR_COMPRESSION_NONE &&
            curpart->comp_type != EXR_COMPRESSION_RLE &&
            curpart->comp_type != EXR_COMPRESSION_ZIPS)
            return f->report_error (
                f, EXR_ERR_INVALID_ATTR, "Invalid compression for deep data");

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}